

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_flush(BGZF *fp)

{
  uint64_t *puVar1;
  void *__src;
  hFILE *fp_00;
  int iVar2;
  uint uVar3;
  ulong __n;
  ulong uVar4;
  ulong totalbytes;
  
  if ((fp->field_0x2 & 3) != 0) {
    iVar2 = fp->block_offset;
    if (fp->mt != (bgzf_mtaux_t *)0x0) {
      if (iVar2 != 0) {
        mt_queue(fp);
      }
      iVar2 = mt_flush_queue(fp);
      return iVar2;
    }
    while (0 < iVar2) {
      if (fp->idx_build_otf != 0) {
        bgzf_index_add_block(fp);
        puVar1 = &fp->idx->ublock_addr;
        *puVar1 = *puVar1 + (long)fp->block_offset;
      }
      uVar3 = deflate_block(fp,fp->block_offset);
      if ((int)uVar3 < 0) {
        return -1;
      }
      __src = fp->compressed_block;
      fp_00 = fp->fp;
      totalbytes = (ulong)uVar3;
      uVar4 = (long)fp_00->limit - (long)fp_00->begin;
      __n = totalbytes;
      if (uVar4 < totalbytes) {
        __n = uVar4;
      }
      memcpy(fp_00->begin,__src,__n);
      fp_00->begin = fp_00->begin + __n;
      if (uVar4 < totalbytes) {
        __n = hwrite2(fp_00,__src,totalbytes,__n);
      }
      if (__n != totalbytes) {
        *(byte *)fp = *(byte *)fp | 4;
        return -1;
      }
      fp->block_address = fp->block_address + totalbytes;
      iVar2 = fp->block_offset;
    }
  }
  return 0;
}

Assistant:

int bgzf_flush(BGZF *fp)
{
    if (!fp->is_write) return 0;
#ifdef BGZF_MT
    if (fp->mt) {
        if (fp->block_offset) mt_queue(fp); // guaranteed that assertion does not fail
        return mt_flush_queue(fp);
    }
#endif
    while (fp->block_offset > 0) {
        if ( fp->idx_build_otf )
        {
            bgzf_index_add_block(fp);
            fp->idx->ublock_addr += fp->block_offset;
        }
        int block_length = deflate_block(fp, fp->block_offset);
        if (block_length < 0) return -1;
        if (hwrite(fp->fp, fp->compressed_block, block_length) != block_length) {
            fp->errcode |= BGZF_ERR_IO; // possibly truncated file
            return -1;
        }
        fp->block_address += block_length;
    }
    return 0;
}